

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::SampleDepthCase::renderPattern(SampleDepthCase *this)

{
  GLenum GVar1;
  deBool dVar2;
  float fVar3;
  float fVar4;
  undefined1 local_50 [8];
  Vec3 pt2;
  Vec3 pt1;
  Vec3 pt0;
  float angle;
  Vec4 color;
  int i;
  int numPolygons;
  SampleDepthCase *this_local;
  
  do {
    glwClearColor(0.0,0.0,0.0,0.0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glClearColor(0.0f, 0.0f, 0.0f, 0.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x438);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwClearDepthf(1.0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glClearDepthf(1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x439);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwClear(0x4100);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x43a);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  for (color.m_data[2] = 0.0; (int)color.m_data[2] < 0x32;
      color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
    if ((int)color.m_data[2] % 2 == 0) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(pt0.m_data + 2),1.0,1.0,1.0,1.0);
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(pt0.m_data + 2),0.0,0.0,0.0,1.0);
    }
    pt0.m_data[1] =
         (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
         ((float)(int)color.m_data[2] * 6.2831855) / 50.0;
    fVar3 = deFloatCos(pt0.m_data[1] + 0.0);
    fVar4 = deFloatSin(pt0.m_data[1] + 0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(pt1.m_data + 1),fVar3 * 3.0,fVar4 * 3.0,1.0);
    fVar3 = deFloatCos(pt0.m_data[1] + 2.0943952);
    fVar4 = deFloatSin(pt0.m_data[1] + 2.0943952);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(pt2.m_data + 1),fVar3 * 3.0,fVar4 * 3.0,0.0);
    fVar3 = deFloatCos(pt0.m_data[1] + 4.1887903);
    fVar4 = deFloatSin(pt0.m_data[1] + 4.1887903);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_50,fVar3 * 3.0,fVar4 * 3.0,0.0);
    MultisampleCase::renderTriangle
              ((MultisampleCase *)this,(Vec3 *)(pt1.m_data + 1),(Vec3 *)(pt2.m_data + 1),
               (Vec3 *)local_50,(Vec4 *)(pt0.m_data + 2));
  }
  return;
}

Assistant:

void SampleDepthCase::renderPattern (void) const
{
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 0.0f));
	GLU_CHECK_CALL(glClearDepthf(1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT));

	{
		const int numPolygons = 50;

		for (int i = 0; i < numPolygons; i++)
		{
			Vec4	color	= i % 2 == 0 ? Vec4(1.0f, 1.0f, 1.0f, 1.0f) : Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			float	angle	= 2.0f * DE_PI * (float)i / (float)numPolygons + 0.001f*(float)m_currentIteration;
			Vec3	pt0		(3.0f*deFloatCos(angle + 2.0f*DE_PI*0.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*0.0f/3.0f), 1.0f);
			Vec3	pt1		(3.0f*deFloatCos(angle + 2.0f*DE_PI*1.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*1.0f/3.0f), 0.0f);
			Vec3	pt2		(3.0f*deFloatCos(angle + 2.0f*DE_PI*2.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*2.0f/3.0f), 0.0f);

			renderTriangle(pt0, pt1, pt2, color);
		}
	}
}